

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

RPCHelpMan * getnodeaddresses(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  allocator<RPCResult> *in_stack_ffffffffffffee78;
  RPCArg *this;
  UniValue *in_stack_ffffffffffffee80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffee88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffee90;
  undefined1 in_stack_ffffffffffffeea7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffeea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffeeb0;
  UniValue *in_stack_ffffffffffffeeb8;
  iterator in_stack_ffffffffffffeec0;
  RPCArgOptions *in_stack_ffffffffffffeec8;
  string *in_stack_ffffffffffffeed0;
  undefined7 in_stack_ffffffffffffeed8;
  undefined1 in_stack_ffffffffffffeedf;
  undefined4 in_stack_ffffffffffffeee0;
  Type in_stack_ffffffffffffeee4;
  string *in_stack_ffffffffffffeee8;
  RPCArg *in_stack_ffffffffffffeef0;
  undefined4 in_stack_ffffffffffffeef8;
  Type in_stack_ffffffffffffeefc;
  RPCResult *in_stack_ffffffffffffef00;
  undefined1 *local_10e8;
  undefined1 *local_10d0;
  undefined1 *local_10b8;
  RPCExamples *examples;
  RPCResults *results;
  vector<RPCArg,_std::allocator<RPCArg>_> *args;
  string *description;
  string *name;
  RPCHelpMan *this_00;
  RPCMethodImpl *fun;
  undefined1 local_ed8 [37];
  allocator<char> local_eb3;
  allocator<char> local_eb2;
  allocator<char> local_eb1;
  allocator<char> local_eb0;
  allocator<char> local_eaf;
  allocator<char> local_eae;
  allocator<char> local_ead;
  allocator<char> local_eac;
  allocator<char> local_eab [3];
  pointer local_ea8;
  pointer pRStack_ea0;
  undefined1 local_e98 [47];
  undefined1 local_e69 [31];
  undefined1 local_e4a;
  undefined1 local_e49 [32];
  allocator<char> local_e29;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e28;
  undefined1 local_e18 [15];
  allocator<char> local_e09;
  size_type local_e08;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_e00;
  allocator<char> local_de1 [31];
  allocator<char> local_dc2;
  allocator<char> local_dc1 [31];
  allocator<char> local_da2;
  allocator<char> local_da1 [62];
  allocator<char> local_d63;
  allocator<char> local_d62;
  allocator<char> local_d61;
  undefined4 local_d60;
  allocator<char> local_d59 [31];
  allocator<char> local_d3a;
  allocator<char> local_d39 [1057];
  undefined1 local_918 [408];
  string local_780 [4];
  RPCExamples local_6f8 [4];
  undefined1 local_670 [64];
  undefined1 local_630 [136];
  undefined1 local_5a8 [200];
  undefined1 local_4e0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined1 local_4a0;
  undefined1 local_49f;
  undefined1 local_398;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined1 local_358;
  undefined1 local_357;
  undefined1 local_258 [528];
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeec8,(char *)in_stack_ffffffffffffeec0,
             (allocator<char> *)in_stack_ffffffffffffeeb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeec8,(char *)in_stack_ffffffffffffeec0,
             (allocator<char> *)in_stack_ffffffffffffeeb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeec8,(char *)in_stack_ffffffffffffeec0,
             (allocator<char> *)in_stack_ffffffffffffeeb8);
  local_d60 = 1;
  UniValue::UniValue<int,_int,_true>(in_stack_ffffffffffffeeb8,(int *)in_stack_ffffffffffffeeb0);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffee88,in_stack_ffffffffffffee80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeec8,(char *)in_stack_ffffffffffffeec0,
             (allocator<char> *)in_stack_ffffffffffffeeb8);
  local_398 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffee90);
  local_370 = 0;
  uStack_368 = 0;
  local_360 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffee78);
  local_358 = 0;
  local_357 = 0;
  RPCArg::RPCArg(in_stack_ffffffffffffeef0,in_stack_ffffffffffffeee8,in_stack_ffffffffffffeee4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffeedf,in_stack_ffffffffffffeed8),
                 in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeec8,(char *)in_stack_ffffffffffffeec0,
             (allocator<char> *)in_stack_ffffffffffffeeb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeec8,(char *)in_stack_ffffffffffffeec0,
             (allocator<char> *)in_stack_ffffffffffffeeb8);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffee88,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee80);
  GetNetworkNames_abi_cxx11_((bool)in_stack_ffffffffffffeea7);
  util::Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3]>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffee90,(char (*) [3])in_stack_ffffffffffffee88);
  std::operator+((char *)in_stack_ffffffffffffee90,in_stack_ffffffffffffee88);
  std::operator+(in_stack_ffffffffffffee90,(char *)in_stack_ffffffffffffee88);
  local_4e0 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffee90);
  local_4b8 = 0;
  uStack_4b0 = 0;
  local_4a8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffee78);
  local_4a0 = 0;
  local_49f = 0;
  RPCArg::RPCArg(in_stack_ffffffffffffeef0,in_stack_ffffffffffffeee8,in_stack_ffffffffffffeee4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffeedf,in_stack_ffffffffffffeed8),
                 in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8);
  std::allocator<RPCArg>::allocator((allocator<RPCArg> *)in_stack_ffffffffffffee78);
  __l._M_len = (size_type)in_stack_ffffffffffffeec8;
  __l._M_array = in_stack_ffffffffffffeec0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffeeb8,__l,
             (allocator_type *)in_stack_ffffffffffffeeb0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeec8,(char *)in_stack_ffffffffffffeec0,
             (allocator<char> *)in_stack_ffffffffffffeeb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeec8,(char *)in_stack_ffffffffffffeec0,
             (allocator<char> *)in_stack_ffffffffffffeeb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeec8,(char *)in_stack_ffffffffffffeec0,
             (allocator<char> *)in_stack_ffffffffffffeeb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeec8,(char *)in_stack_ffffffffffffeec0,
             (allocator<char> *)in_stack_ffffffffffffeeb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeec8,(char *)in_stack_ffffffffffffeec0,
             (allocator<char> *)in_stack_ffffffffffffeeb8);
  std::operator+(&in_stack_ffffffffffffeec8->skip_type_check,&in_stack_ffffffffffffeec0->m_names);
  std::operator+(in_stack_ffffffffffffee90,(char *)in_stack_ffffffffffffee88);
  local_e08 = 0;
  aStack_e00._M_allocated_capacity = 0;
  aStack_e00._8_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffee78);
  RPCResult::RPCResult
            (in_stack_ffffffffffffef00,in_stack_ffffffffffffeefc,&in_stack_ffffffffffffeef0->m_names
             ,in_stack_ffffffffffffeee8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffeee4,in_stack_ffffffffffffeee0),
             (bool)in_stack_ffffffffffffeedf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeec8,(char *)in_stack_ffffffffffffeec0,
             (allocator<char> *)in_stack_ffffffffffffeeb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeec8,(char *)in_stack_ffffffffffffeec0,
             (allocator<char> *)in_stack_ffffffffffffeeb8);
  local_e28._M_allocated_capacity = 0;
  local_e28._8_8_ = 0;
  local_e18._0_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffee78);
  RPCResult::RPCResult
            (in_stack_ffffffffffffef00,in_stack_ffffffffffffeefc,&in_stack_ffffffffffffeef0->m_names
             ,in_stack_ffffffffffffeee8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffeee4,in_stack_ffffffffffffeee0),
             (bool)in_stack_ffffffffffffeedf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeec8,(char *)in_stack_ffffffffffffeec0,
             (allocator<char> *)in_stack_ffffffffffffeeb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeec8,(char *)in_stack_ffffffffffffeec0,
             (allocator<char> *)in_stack_ffffffffffffeeb8);
  local_e49._1_8_ = 0;
  local_e49._9_8_ = 0;
  local_e49._17_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffee78);
  RPCResult::RPCResult
            (in_stack_ffffffffffffef00,in_stack_ffffffffffffeefc,&in_stack_ffffffffffffeef0->m_names
             ,in_stack_ffffffffffffeee8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffeee4,in_stack_ffffffffffffeee0),
             (bool)in_stack_ffffffffffffeedf);
  name = local_780;
  this_00 = (RPCHelpMan *)local_e49;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeec8,(char *)in_stack_ffffffffffffeec0,
             (allocator<char> *)in_stack_ffffffffffffeeb8);
  description = (string *)&local_e4a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeec8,(char *)in_stack_ffffffffffffeec0,
             (allocator<char> *)in_stack_ffffffffffffeeb8);
  local_e69._1_8_ = 0;
  local_e69._9_8_ = 0;
  local_e69._17_8_ = 0;
  args = (vector<RPCArg,_std::allocator<RPCArg>_> *)(local_e69 + 1);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffee78);
  RPCResult::RPCResult
            (in_stack_ffffffffffffef00,in_stack_ffffffffffffeefc,&in_stack_ffffffffffffeef0->m_names
             ,in_stack_ffffffffffffeee8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffeee4,in_stack_ffffffffffffeee0),
             (bool)in_stack_ffffffffffffeedf);
  examples = local_6f8;
  results = (RPCResults *)local_e69;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeec8,(char *)in_stack_ffffffffffffeec0,
             (allocator<char> *)in_stack_ffffffffffffeeb8);
  GetNetworkNames_abi_cxx11_((bool)in_stack_ffffffffffffeea7);
  util::Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3]>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffee90,(char (*) [3])in_stack_ffffffffffffee88);
  std::operator+((char *)in_stack_ffffffffffffee90,in_stack_ffffffffffffee88);
  std::operator+(in_stack_ffffffffffffee90,(char *)in_stack_ffffffffffffee88);
  local_ea8 = (pointer)0x0;
  pRStack_ea0 = (pointer)0x0;
  local_e98._0_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffee78);
  RPCResult::RPCResult
            (in_stack_ffffffffffffef00,in_stack_ffffffffffffeefc,&in_stack_ffffffffffffeef0->m_names
             ,in_stack_ffffffffffffeee8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffeee4,in_stack_ffffffffffffeee0),
             (bool)in_stack_ffffffffffffeedf);
  std::allocator<RPCResult>::allocator(in_stack_ffffffffffffee78);
  __l_00._M_len = (size_type)in_stack_ffffffffffffeec8;
  __l_00._M_array = (iterator)in_stack_ffffffffffffeec0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffeeb8,__l_00,
             (allocator_type *)in_stack_ffffffffffffeeb0);
  RPCResult::RPCResult
            (in_stack_ffffffffffffef00,in_stack_ffffffffffffeefc,&in_stack_ffffffffffffeef0->m_names
             ,in_stack_ffffffffffffeee8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffeee4,in_stack_ffffffffffffeee0),
             (bool)in_stack_ffffffffffffeedf);
  fun = (RPCMethodImpl *)0x1;
  std::allocator<RPCResult>::allocator(in_stack_ffffffffffffee78);
  __l_01._M_len = (size_type)in_stack_ffffffffffffeec8;
  __l_01._M_array = (iterator)in_stack_ffffffffffffeec0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffeeb8,__l_01,
             (allocator_type *)in_stack_ffffffffffffeeb0);
  RPCResult::RPCResult
            (in_stack_ffffffffffffef00,in_stack_ffffffffffffeefc,&in_stack_ffffffffffffeef0->m_names
             ,in_stack_ffffffffffffeee8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffeee4,in_stack_ffffffffffffeee0),
             (bool)in_stack_ffffffffffffeedf);
  RPCResults::RPCResults
            ((RPCResults *)CONCAT44(in_stack_ffffffffffffeefc,in_stack_ffffffffffffeef8),
             (RPCResult *)in_stack_ffffffffffffeef0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeec8,(char *)in_stack_ffffffffffffeec0,
             (allocator<char> *)in_stack_ffffffffffffeeb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeec8,(char *)in_stack_ffffffffffffeec0,
             (allocator<char> *)in_stack_ffffffffffffeeb8);
  HelpExampleCli(in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeea8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeec8,(char *)in_stack_ffffffffffffeec0,
             (allocator<char> *)in_stack_ffffffffffffeeb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeec8,(char *)in_stack_ffffffffffffeec0,
             (allocator<char> *)in_stack_ffffffffffffeeb8);
  HelpExampleCli(in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeea8);
  std::operator+(in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeea8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeec8,(char *)in_stack_ffffffffffffeec0,
             (allocator<char> *)in_stack_ffffffffffffeeb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeec8,(char *)in_stack_ffffffffffffeec0,
             (allocator<char> *)in_stack_ffffffffffffeeb8);
  HelpExampleCli(in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeea8);
  std::operator+(in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeea8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeec8,(char *)in_stack_ffffffffffffeec0,
             (allocator<char> *)in_stack_ffffffffffffeeb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeec8,(char *)in_stack_ffffffffffffeec0,
             (allocator<char> *)in_stack_ffffffffffffeeb8);
  HelpExampleRpc(in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeea8);
  std::operator+(in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeea8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeec8,(char *)in_stack_ffffffffffffeec0,
             (allocator<char> *)in_stack_ffffffffffffeeb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeec8,(char *)in_stack_ffffffffffffeec0,
             (allocator<char> *)in_stack_ffffffffffffeeb8);
  HelpExampleRpc(in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeea8);
  std::operator+(in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeea8);
  RPCExamples::RPCExamples((RPCExamples *)in_stack_ffffffffffffee78,(string *)0x650277);
  this = (RPCArg *)local_ed8;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<getnodeaddresses()::__0,void>
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)
             in_stack_ffffffffffffee88,(anon_class_1_0_00000001 *)in_stack_ffffffffffffee80);
  RPCHelpMan::RPCHelpMan(this_00,name,description,args,results,examples,fun);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_ed8 + 0x24));
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_eb3);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_eb2);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_eb1);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_eb0);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_eaf);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_eae);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_ead);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_eac);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_eab);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult((RPCResult *)this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffee88);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_10b8 = local_5a8;
  do {
    local_10b8 = local_10b8 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_10b8 != local_630);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffee88);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_10d0 = local_670;
  do {
    local_10d0 = local_10d0 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_10d0 != local_918);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffee88);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffee88);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_e69);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffee88);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_e4a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_e49);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffee88);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_e49 + 0x1f));
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_e29);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffee88);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_e18 + 0xe));
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_e09);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffee88);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_de1);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_dc2);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_dc1);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_da2);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_da1);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffee88);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  local_10e8 = local_48;
  do {
    local_10e8 = local_10e8 + -0x108;
    RPCArg::~RPCArg(this);
  } while (local_10e8 != local_258);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffee88);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_d63);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_d62);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_d61);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  UniValue::~UniValue((UniValue *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_d59);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_d3a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_d39);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan getnodeaddresses()
{
    return RPCHelpMan{"getnodeaddresses",
                "Return known addresses, after filtering for quality and recency.\n"
                "These can potentially be used to find new peers in the network.\n"
                "The total number of addresses known to the node may be higher.",
                {
                    {"count", RPCArg::Type::NUM, RPCArg::Default{1}, "The maximum number of addresses to return. Specify 0 to return all known addresses."},
                    {"network", RPCArg::Type::STR, RPCArg::DefaultHint{"all networks"}, "Return only addresses of the specified network. Can be one of: " + Join(GetNetworkNames(), ", ") + "."},
                },
                RPCResult{
                    RPCResult::Type::ARR, "", "",
                    {
                        {RPCResult::Type::OBJ, "", "",
                        {
                            {RPCResult::Type::NUM_TIME, "time", "The " + UNIX_EPOCH_TIME + " when the node was last seen"},
                            {RPCResult::Type::NUM, "services", "The services offered by the node"},
                            {RPCResult::Type::STR, "address", "The address of the node"},
                            {RPCResult::Type::NUM, "port", "The port number of the node"},
                            {RPCResult::Type::STR, "network", "The network (" + Join(GetNetworkNames(), ", ") + ") the node connected through"},
                        }},
                    }
                },
                RPCExamples{
                    HelpExampleCli("getnodeaddresses", "8")
                    + HelpExampleCli("getnodeaddresses", "4 \"i2p\"")
                    + HelpExampleCli("-named getnodeaddresses", "network=onion count=12")
                    + HelpExampleRpc("getnodeaddresses", "8")
                    + HelpExampleRpc("getnodeaddresses", "4, \"i2p\"")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    NodeContext& node = EnsureAnyNodeContext(request.context);
    const CConnman& connman = EnsureConnman(node);

    const int count{request.params[0].isNull() ? 1 : request.params[0].getInt<int>()};
    if (count < 0) throw JSONRPCError(RPC_INVALID_PARAMETER, "Address count out of range");

    const std::optional<Network> network{request.params[1].isNull() ? std::nullopt : std::optional<Network>{ParseNetwork(request.params[1].get_str())}};
    if (network == NET_UNROUTABLE) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("Network not recognized: %s", request.params[1].get_str()));
    }

    // returns a shuffled list of CAddress
    const std::vector<CAddress> vAddr{connman.GetAddresses(count, /*max_pct=*/0, network)};
    UniValue ret(UniValue::VARR);

    for (const CAddress& addr : vAddr) {
        UniValue obj(UniValue::VOBJ);
        obj.pushKV("time", int64_t{TicksSinceEpoch<std::chrono::seconds>(addr.nTime)});
        obj.pushKV("services", (uint64_t)addr.nServices);
        obj.pushKV("address", addr.ToStringAddr());
        obj.pushKV("port", addr.GetPort());
        obj.pushKV("network", GetNetworkName(addr.GetNetClass()));
        ret.push_back(std::move(obj));
    }
    return ret;
},
    };
}